

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_cpp_add_bulk(void **param_1)

{
  bool bVar1;
  reference puVar2;
  uint value;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  BulkContext bulk_context;
  Roaring r2;
  Roaring r1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  Roaring *in_stack_ffffffffffffff08;
  Roaring *in_stack_ffffffffffffff10;
  char *expression;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_d0;
  allocator_type *in_stack_ffffffffffffff38;
  container_s *in_stack_ffffffffffffff40;
  initializer_list<unsigned_int> in_stack_ffffffffffffff48;
  Roaring local_88;
  char local_49;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined8 *local_30;
  undefined8 local_28;
  
  local_48 = 0x7b0000270f;
  uStack_40 = 0xfffffff7ffffffff;
  local_38 = 9999;
  local_30 = &local_48;
  local_28 = 5;
  expression = &local_49;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x10ac17);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff38);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x10ac48);
  roaring::Roaring::Roaring(in_stack_ffffffffffffff10);
  roaring::Roaring::Roaring(in_stack_ffffffffffffff10);
  roaring::BulkContext::BulkContext((BulkContext *)&stack0xffffffffffffff40);
  local_d0._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_ffffffffffffff08);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_d0);
    in_stack_ffffffffffffff24 = *puVar2;
    in_stack_ffffffffffffff08 = &local_88;
    roaring::Roaring::addBulk(in_stack_ffffffffffffff10,(BulkContext *)in_stack_ffffffffffffff08,0);
    in_stack_ffffffffffffff10 = (Roaring *)&stack0xffffffffffffff50;
    roaring::Roaring::add
              (in_stack_ffffffffffffff10,(uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    roaring::Roaring::operator==(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    _assert_true(CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),expression,
                 (char *)in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_d0);
  }
  roaring::Roaring::~Roaring(in_stack_ffffffffffffff10);
  roaring::Roaring::~Roaring(in_stack_ffffffffffffff10);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  return;
}

Assistant:

DEFINE_TEST(test_cpp_add_bulk) {
    std::vector<uint32_t> values = {9999, 123, 0xFFFFFFFF, 0xFFFFFFF7, 9999};
    Roaring r1;
    Roaring r2;
    roaring::BulkContext bulk_context;
    for (const auto value : values) {
        r1.addBulk(bulk_context, value);
        r2.add(value);
        assert_true(r1 == r2);
    }
}